

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

pair<wchar_t,_unsigned_long>
mjs::anon_unknown_2::get_octal_escape_sequence(wstring_view *text,size_t pos)

{
  int iVar1;
  const_reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  bool bVar5;
  pair<wchar_t,_unsigned_long> pVar6;
  wchar_t local_48;
  uint local_44;
  ulong uStack_40;
  uint this_digit;
  size_t len;
  size_t max_len;
  size_t sStack_28;
  uint value;
  size_t pos_local;
  wstring_view *text_local;
  unsigned_long local_10;
  
  sStack_28 = pos;
  pos_local = (size_t)text;
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[](text,pos);
  max_len._4_4_ = try_get_decimal_value(*pvVar2);
  if (7 < (uint)max_len._4_4_) {
    __assert_fail("value < 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0xa9,
                  "std::pair<wchar_t, size_t> mjs::(anonymous namespace)::get_octal_escape_sequence(const std::wstring_view &, size_t)"
                 );
  }
  iVar1 = 2;
  if ((uint)max_len._4_4_ < 4) {
    iVar1 = 3;
  }
  len = (size_t)iVar1;
  uStack_40 = 1;
  while( true ) {
    bVar5 = false;
    if (uStack_40 < len) {
      uVar3 = sStack_28 + uStack_40;
      sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local);
      bVar5 = uVar3 < sVar4;
    }
    if (!bVar5) break;
    pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pos_local,
                        sStack_28 + uStack_40);
    local_44 = try_get_decimal_value(*pvVar2);
    if (7 < local_44) break;
    max_len._4_4_ = max_len._4_4_ * 8 + local_44;
    uStack_40 = uStack_40 + 1;
  }
  local_48 = max_len._4_4_;
  std::pair<wchar_t,_unsigned_long>::pair<wchar_t,_unsigned_long_&,_true>
            ((pair<wchar_t,_unsigned_long> *)&text_local,&local_48,&stack0xffffffffffffffc0);
  pVar6._4_4_ = 0;
  pVar6.first = (uint)text_local;
  pVar6.second = local_10;
  return pVar6;
}

Assistant:

std::pair<wchar_t, size_t> get_octal_escape_sequence(const std::wstring_view& text, size_t pos) {
    auto value = try_get_decimal_value(text[pos]);
    assert(value < 8);
    const size_t max_len = value < 4 ? 3 : 2;
    size_t len = 1;
    for (; len < max_len && pos+len < text.size(); ++len) {
        const auto this_digit = try_get_decimal_value(text[pos+len]);
        if (this_digit > 7) {
            break;
        }
        value = value*8 + this_digit;
    }
    return { static_cast<wchar_t>(value), len };
}